

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_FindValueByNumber_Test::
EnumDescriptorTest_FindValueByNumber_Test(EnumDescriptorTest_FindValueByNumber_Test *this)

{
  EnumDescriptorTest::EnumDescriptorTest(&this->super_EnumDescriptorTest);
  (this->super_EnumDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumDescriptorTest_015f4088;
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, FindValueByNumber) {
  EXPECT_EQ(foo_, enum_->FindValueByNumber(1));
  EXPECT_EQ(bar_, enum_->FindValueByNumber(2));
  EXPECT_EQ(foo2_, enum2_->FindValueByNumber(1));
  EXPECT_EQ(baz2_, enum2_->FindValueByNumber(3));

  EXPECT_TRUE(enum_->FindValueByNumber(416) == nullptr);
  EXPECT_TRUE(enum_->FindValueByNumber(3) == nullptr);
  EXPECT_TRUE(enum2_->FindValueByNumber(2) == nullptr);
}